

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-tracer.cpp
# Opt level: O0

void __thiscall test_tracer::test_method(test_tracer *this)

{
  string *psVar1;
  long lVar2;
  string *psVar3;
  long *local_3a8;
  long *local_380;
  string *local_2d8;
  int local_2ac;
  undefined8 uStack_2a8;
  int i;
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [32];
  long *local_250;
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *aSignalVector;
  string local_240 [32];
  long *local_220;
  Signal<double,_int> *aSignalInt;
  string local_210 [32];
  string *local_1f0;
  SignalBase<int> *aSignal;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [8];
  string suffix;
  string local_118 [8];
  string basename;
  string local_f0 [8];
  string rootdir;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  string *local_80;
  Entity *entity;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  Tracer *atracer;
  test_tracer *this_local;
  
  atracer = (Tracer *)this;
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Tracer",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"my-tracer",(allocator<char> *)((long)&entity + 7));
  lVar2 = dynamicgraph::FactoryStorage::newEntity(psVar1,local_38);
  if (lVar2 == 0) {
    local_2d8 = (string *)0x0;
  }
  else {
    local_2d8 = (string *)
                __dynamic_cast(lVar2,&dynamicgraph::Entity::typeinfo,&dynamicgraph::Tracer::typeinfo
                               ,0);
  }
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&entity + 7));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = local_2d8;
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"MyEntity",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"my-entity",(allocator<char> *)(rootdir.field_2._M_local_buf + 0xf));
  psVar1 = (string *)dynamicgraph::FactoryStorage::newEntity(psVar1,local_a0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(rootdir.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"/tmp",(allocator<char> *)(basename.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(basename.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"my-tracer",(allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,".dat",&local_141);
  std::allocator<char>::~allocator(&local_141);
  dynamicgraph::Tracer::openFiles(local_18,local_f0,local_118);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my-entity.out_double",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"output",&local_191);
  dynamicgraph::Tracer::addSignalToTraceByName(psVar1,local_168);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"my-entity.out_vector",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"output-vector",(allocator<char> *)((long)&aSignal + 7));
  dynamicgraph::Tracer::addSignalToTraceByName(psVar1,local_1b8);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aSignal + 7));
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  psVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"out2double",(allocator<char> *)((long)&aSignalInt + 7));
  psVar3 = (string *)dynamicgraph::Entity::getSignal(psVar1);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aSignalInt + 7));
  psVar1 = local_80;
  local_1f0 = psVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,"in_double",(allocator<char> *)((long)&aSignalVector + 7));
  lVar2 = dynamicgraph::Entity::getSignal(psVar1);
  if (lVar2 == 0) {
    local_380 = (long *)0x0;
  }
  else {
    local_380 = (long *)__dynamic_cast(lVar2,&dynamicgraph::SignalBase<int>::typeinfo,
                                       &dynamicgraph::Signal<double,int>::typeinfo,0);
  }
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aSignalVector + 7));
  psVar1 = local_80;
  local_220 = local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"out_vector",&local_271);
  lVar2 = dynamicgraph::Entity::getSignal(psVar1);
  if (lVar2 == 0) {
    local_3a8 = (long *)0x0;
  }
  else {
    local_3a8 = (long *)__dynamic_cast(lVar2,&dynamicgraph::SignalBase<int>::typeinfo,
                                       &dynamicgraph::Signal<Eigen::Matrix<double,-1,1,0,-1,1>,int>
                                        ::typeinfo,0);
  }
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  psVar3 = local_18;
  psVar1 = local_1f0;
  local_250 = local_3a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"output2",&local_299);
  dynamicgraph::Tracer::addSignalToTrace((SignalBase *)psVar3,psVar1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  uStack_2a8 = 0x3ff8000000000000;
  (**(code **)(*local_220 + 0xc0))(local_220,&stack0xfffffffffffffd58);
  dynamicgraph::Tracer::start((Tracer *)local_18);
  for (local_2ac = 0; local_2ac < 1000; local_2ac = local_2ac + 1) {
    (**(code **)(*(long *)local_1f0 + 0x18))(local_1f0,&local_2ac);
    (**(code **)(*local_220 + 0xe0))(local_220,&local_2ac);
    (**(code **)(*local_220 + 0x18))(local_220,&local_2ac);
    (**(code **)(*local_250 + 0x98))(local_250,&local_2ac);
    (**(code **)(*local_250 + 0x18))(local_250,&local_2ac);
    dynamicgraph::Tracer::recordTrigger((int *)local_18,&local_2ac);
  }
  dynamicgraph::Tracer::stop((Tracer *)local_18);
  dynamicgraph::Tracer::clearSignalToTrace();
  (**(code **)(*(long *)local_18 + 0x48))();
  dynamicgraph::Tracer::record();
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracer) {
  using dynamicgraph::Vector;

  // Creates a tracer.
  dynamicgraph::Tracer &atracer = *dynamic_cast<dynamicgraph::Tracer *>(
      dynamicgraph::FactoryStorage::getInstance()->newEntity("Tracer",
                                                             "my-tracer"));

  dynamicgraph::Entity &entity =
      *dynamicgraph::FactoryStorage::getInstance()->newEntity("MyEntity",
                                                              "my-entity");

  std::string rootdir("/tmp");
  std::string basename("my-tracer");
  std::string suffix(".dat");

  /// Test openfiles
  atracer.openFiles(rootdir, basename, suffix);

  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_double", "output");
  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_vector", "output-vector");

  dynamicgraph::SignalBase<int> &aSignal = entity.getSignal("out2double");

  dynamicgraph::Signal<double, int> &aSignalInt =
      *(dynamic_cast<dynamicgraph::Signal<double, int> *>(
          &entity.getSignal("in_double")));

  dynamicgraph::Signal<Vector, int> &aSignalVector =
      *(dynamic_cast<dynamicgraph::Signal<Vector, int> *>(
          &entity.getSignal("out_vector")));

  /// Add trace by signal object
  atracer.addSignalToTrace(aSignal, "output2");

  aSignalInt.setConstant(1.5);

  atracer.start();

  for (int i = 0; i < 1000; i++) {
    aSignal.setTime(i);
    aSignalInt.access(i);
    aSignalInt.setTime(i);
    aSignalVector.recompute(i);
    aSignalVector.setTime(i);
    atracer.recordTrigger(i, i);
  }

  atracer.stop();
  atracer.clearSignalToTrace();
  atracer.closeFiles();

  atracer.record();
}